

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O3

Value __thiscall
jbcoin::STInteger<unsigned_short>::getJson(STInteger<unsigned_short> *this,int param_1)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  undefined4 extraout_var;
  _Base_ptr in_RDX;
  _Base_ptr p_Var6;
  _Base_ptr extraout_RDX;
  undefined4 in_register_00000034;
  long lVar7;
  Value VVar8;
  
  lVar7 = CONCAT44(in_register_00000034,param_1);
  if (**(int **)(lVar7 + 8) == sfLedgerEntryType) {
    LedgerFormats::getInstance();
    in_RDX = LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
             m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) goto LAB_001b2455;
    uVar1 = *(ushort *)(lVar7 + 0x10);
    p_Var5 = &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
              m_types._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
             m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)(uint)uVar1 <= (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)(uint)uVar1];
    } while (p_Var6 != (_Base_ptr)0x0);
    in_RDX = &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
              m_types._M_t._M_impl.super__Rb_tree_header._M_header;
    if ((((_Rb_tree_header *)p_Var5 ==
          &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types.
           _M_t._M_impl.super__Rb_tree_header) || ((int)(uint)uVar1 < (int)p_Var5[1]._M_color)) ||
       (p_Var6 = p_Var5[1]._M_parent, p_Var6 == (_Base_ptr)0x0)) goto LAB_001b2455;
    *(ushort *)&(this->super_STBase).fName =
         (ushort)*(undefined4 *)&(this->super_STBase).fName & 0xfe00 | 0x104;
    Json::valueAllocator();
    p_Var5 = p_Var6[1]._M_left;
    uVar4 = *(uint *)&p_Var6[1]._M_right;
LAB_001b24d6:
    iVar3 = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                      (Json::valueAllocator::valueAllocator,p_Var5,(ulong)uVar4);
    (this->super_STBase)._vptr_STBase = (_func_int **)CONCAT44(extraout_var,iVar3);
    in_RDX = extraout_RDX;
  }
  else {
LAB_001b2455:
    if (**(int **)(lVar7 + 8) == sfTransactionType) {
      TxFormats::getInstance();
      uVar1 = *(ushort *)(lVar7 + 0x10);
      uVar2 = (uint)uVar1;
      in_RDX = TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
               _M_impl.super__Rb_tree_header._M_header._M_parent;
      uVar4 = (uint)uVar1;
      if (TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t._M_impl.
          super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var5 = &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
                  _M_impl.super__Rb_tree_header._M_header;
        p_Var6 = TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
                 _M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if ((int)(uint)uVar1 <= (int)p_Var6[1]._M_color) {
            p_Var5 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)(uint)uVar1];
        } while (p_Var6 != (_Base_ptr)0x0);
        in_RDX = &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
                  _M_impl.super__Rb_tree_header._M_header;
        uVar4 = uVar2;
        if ((((_Rb_tree_header *)p_Var5 !=
              &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
               _M_impl.super__Rb_tree_header) && ((int)p_Var5[1]._M_color <= (int)(uint)uVar1)) &&
           (p_Var6 = p_Var5[1]._M_parent, p_Var6 != (_Base_ptr)0x0)) {
          *(ushort *)&(this->super_STBase).fName =
               (ushort)*(undefined4 *)&(this->super_STBase).fName & 0xfe00 | 0x104;
          Json::valueAllocator();
          p_Var5 = p_Var6[1]._M_left;
          uVar4 = *(uint *)&p_Var6[1]._M_right;
          goto LAB_001b24d6;
        }
      }
    }
    else {
      uVar4 = (uint)*(ushort *)(lVar7 + 0x10);
    }
    *(undefined1 *)&(this->super_STBase).fName = 1;
    *(uint *)&(this->super_STBase)._vptr_STBase = uVar4;
  }
  VVar8._8_8_ = in_RDX;
  VVar8.value_.map_ = (ObjectValues *)this;
  return VVar8;
}

Assistant:

Json::Value
STUInt16::getJson (int) const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item = TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return value_;
}